

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_transform.cc
# Opt level: O3

bool __thiscall
draco::AttributeTransform::TransferToAttribute(AttributeTransform *this,PointAttribute *attribute)

{
  AttributeTransformData *__ptr;
  AttributeTransformData *pAVar1;
  
  pAVar1 = (AttributeTransformData *)operator_new(0x30);
  pAVar1->transform_type_ = ATTRIBUTE_INVALID_TRANSFORM;
  DataBuffer::DataBuffer(&pAVar1->buffer_);
  (*this->_vptr_AttributeTransform[4])(this,pAVar1);
  __ptr = (attribute->attribute_transform_data_)._M_t.
          super___uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
          ._M_t.
          super__Tuple_impl<0UL,_draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>
          .super__Head_base<0UL,_draco::AttributeTransformData_*,_false>._M_head_impl;
  (attribute->attribute_transform_data_)._M_t.
  super___uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
  ._M_t.
  super__Tuple_impl<0UL,_draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>
  .super__Head_base<0UL,_draco::AttributeTransformData_*,_false>._M_head_impl = pAVar1;
  if (__ptr != (AttributeTransformData *)0x0) {
    std::default_delete<draco::AttributeTransformData>::operator()
              ((default_delete<draco::AttributeTransformData> *)
               &attribute->attribute_transform_data_,__ptr);
  }
  return true;
}

Assistant:

bool AttributeTransform::TransferToAttribute(PointAttribute *attribute) const {
  std::unique_ptr<AttributeTransformData> transform_data(
      new AttributeTransformData());
  this->CopyToAttributeTransformData(transform_data.get());
  attribute->SetAttributeTransformData(std::move(transform_data));
  return true;
}